

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::StartSection(BasicReporter *this,string *sectionName,string *param_2)

{
  SpanInfo local_48;
  string *local_20;
  string *param_2_local;
  string *sectionName_local;
  BasicReporter *this_local;
  
  local_20 = param_2;
  param_2_local = sectionName;
  sectionName_local = (string *)this;
  SpanInfo::SpanInfo(&local_48,sectionName);
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  push_back(&this->m_sectionSpans,&local_48);
  SpanInfo::~SpanInfo(&local_48);
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& ) {
            m_sectionSpans.push_back( SpanInfo( sectionName ) );
        }